

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::Initialize(RowGroupCollection *this,PersistentTableData *data)

{
  RowGroupSegmentTree *pRVar1;
  SegmentLock l;
  unique_lock<std::mutex> uStack_28;
  
  pRVar1 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  ::std::unique_lock<std::mutex>::unique_lock
            (&uStack_28,&(pRVar1->super_SegmentTree<duckdb::RowGroup,_true>).node_lock);
  LOCK();
  (this->total_rows).super___atomic_base<unsigned_long>._M_i = data->total_rows;
  UNLOCK();
  pRVar1 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  RowGroupSegmentTree::Initialize(pRVar1,data);
  TableStatistics::Initialize(&this->stats,&this->types,data);
  ::std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void RowGroupCollection::Initialize(PersistentTableData &data) {
	D_ASSERT(this->row_start == 0);
	auto l = row_groups->Lock();
	this->total_rows = data.total_rows;
	row_groups->Initialize(data);
	stats.Initialize(types, data);
}